

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O3

int mbedtls_cipher_check_tag(mbedtls_cipher_context_t *ctx,uchar *tag,size_t tag_len)

{
  mbedtls_cipher_info_t *pmVar1;
  int iVar2;
  size_t sVar3;
  byte bVar4;
  uchar *p1;
  uchar *p2;
  undefined1 auVar5 [16];
  uchar check_tag [16];
  byte local_28;
  uchar uStack_27;
  uchar uStack_26;
  uchar uStack_25;
  uchar uStack_24;
  uchar uStack_23;
  uchar uStack_22;
  uchar uStack_21;
  uchar uStack_20;
  uchar uStack_1f;
  uchar uStack_1e;
  uchar uStack_1d;
  uchar uStack_1c;
  uchar uStack_1b;
  uchar uStack_1a;
  uchar uStack_19;
  
  pmVar1 = ctx->cipher_info;
  if ((pmVar1 == (mbedtls_cipher_info_t *)0x0) || (ctx->operation != MBEDTLS_DECRYPT)) {
    return -0x6100;
  }
  if (pmVar1->mode == MBEDTLS_MODE_GCM) {
    iVar2 = -0x6100;
    if ((tag_len < 0x11) &&
       (iVar2 = mbedtls_gcm_finish((mbedtls_gcm_context *)ctx->cipher_ctx,&local_28,tag_len),
       iVar2 == 0)) {
      if (tag_len != 0) {
        bVar4 = 0;
        sVar3 = 0;
        do {
          bVar4 = bVar4 | (&local_28)[sVar3] ^ tag[sVar3];
          sVar3 = sVar3 + 1;
        } while (tag_len != sVar3);
        if (bVar4 != 0) {
          return -0x6300;
        }
      }
      iVar2 = 0;
    }
  }
  else {
    iVar2 = 0;
    if (((pmVar1->type == MBEDTLS_CIPHER_CHACHA20_POLY1305) && (iVar2 = -0x6100, tag_len == 0x10))
       && (iVar2 = mbedtls_chachapoly_finish
                             ((mbedtls_chachapoly_context *)ctx->cipher_ctx,&local_28), iVar2 == 0))
    {
      auVar5[0] = -(*tag == local_28);
      auVar5[1] = -(tag[1] == uStack_27);
      auVar5[2] = -(tag[2] == uStack_26);
      auVar5[3] = -(tag[3] == uStack_25);
      auVar5[4] = -(tag[4] == uStack_24);
      auVar5[5] = -(tag[5] == uStack_23);
      auVar5[6] = -(tag[6] == uStack_22);
      auVar5[7] = -(tag[7] == uStack_21);
      auVar5[8] = -(tag[8] == uStack_20);
      auVar5[9] = -(tag[9] == uStack_1f);
      auVar5[10] = -(tag[10] == uStack_1e);
      auVar5[0xb] = -(tag[0xb] == uStack_1d);
      auVar5[0xc] = -(tag[0xc] == uStack_1c);
      auVar5[0xd] = -(tag[0xd] == uStack_1b);
      auVar5[0xe] = -(tag[0xe] == uStack_1a);
      auVar5[0xf] = -(tag[0xf] == uStack_19);
      iVar2 = -0x6300;
      if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe | (ushort)(auVar5[0xf] >> 7) << 0xf
                  ) == 0xffff) {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_cipher_check_tag( mbedtls_cipher_context_t *ctx,
                      const unsigned char *tag, size_t tag_len )
{
    unsigned char check_tag[16];
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    CIPHER_VALIDATE_RET( ctx != NULL );
    CIPHER_VALIDATE_RET( tag_len == 0 || tag != NULL );
    if( ctx->cipher_info == NULL )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    if( MBEDTLS_DECRYPT != ctx->operation )
    {
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );
    }

#if defined(MBEDTLS_USE_PSA_CRYPTO)
    if( ctx->psa_enabled == 1 )
    {
        /* While PSA Crypto has an API for multipart
         * operations, we currently don't make it
         * accessible through the cipher layer. */
        return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
    }
#endif /* MBEDTLS_USE_PSA_CRYPTO */

#if defined(MBEDTLS_GCM_C)
    if( MBEDTLS_MODE_GCM == ctx->cipher_info->mode )
    {
        if( tag_len > sizeof( check_tag ) )
            return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

        if( 0 != ( ret = mbedtls_gcm_finish(
                       (mbedtls_gcm_context *) ctx->cipher_ctx,
                       check_tag, tag_len ) ) )
        {
            return( ret );
        }

        /* Check the tag in "constant-time" */
        if( mbedtls_constant_time_memcmp( tag, check_tag, tag_len ) != 0 )
            return( MBEDTLS_ERR_CIPHER_AUTH_FAILED );

        return( 0 );
    }
#endif /* MBEDTLS_GCM_C */

#if defined(MBEDTLS_CHACHAPOLY_C)
    if ( MBEDTLS_CIPHER_CHACHA20_POLY1305 == ctx->cipher_info->type )
    {
        /* Don't allow truncated MAC for Poly1305 */
        if ( tag_len != sizeof( check_tag ) )
            return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

        ret = mbedtls_chachapoly_finish(
            (mbedtls_chachapoly_context*) ctx->cipher_ctx, check_tag );
        if ( ret != 0 )
        {
            return( ret );
        }

        /* Check the tag in "constant-time" */
        if( mbedtls_constant_time_memcmp( tag, check_tag, tag_len ) != 0 )
            return( MBEDTLS_ERR_CIPHER_AUTH_FAILED );

        return( 0 );
    }
#endif /* MBEDTLS_CHACHAPOLY_C */

    return( 0 );
}